

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

Limit __thiscall
google::protobuf::io::CodedInputStream::ReadLengthAndPushLimit(CodedInputStream *this)

{
  bool bVar1;
  Limit LVar2;
  uint32_t local_24;
  uint32_t local_14;
  CodedInputStream *pCStack_10;
  uint32_t length;
  CodedInputStream *this_local;
  
  pCStack_10 = this;
  bVar1 = ReadVarint32(this,&local_14);
  if (bVar1) {
    local_24 = local_14;
  }
  else {
    local_24 = 0;
  }
  LVar2 = PushLimit(this,local_24);
  return LVar2;
}

Assistant:

CodedInputStream::Limit CodedInputStream::ReadLengthAndPushLimit() {
  uint32_t length;
  return PushLimit(ReadVarint32(&length) ? length : 0);
}